

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O1

void __thiscall
SuiteSessionTests::
initiatorFixtureResendRequest_MessagesNotPersistedAndResendEndGreaterThenSeqNumsHelper::RunImpl
          (initiatorFixtureResendRequest_MessagesNotPersistedAndResendEndGreaterThenSeqNumsHelper
           *this)

{
  Message *pMVar1;
  TestResults *pTVar2;
  TestResults **ppTVar3;
  TestDetails **ppTVar4;
  Message resendReq;
  Message receivedLogon;
  Message sentLogon;
  int local_59c;
  undefined **local_598;
  char *local_590;
  char *pcStack_588;
  undefined1 local_580 [16];
  char *pcStack_570;
  undefined1 local_428 [16];
  char *pcStack_418;
  UtcTimeStamp local_2d0 [14];
  Message local_178 [344];
  
  (this->super_initiatorFixture).super_sessionFixture.super_TestCallback.startTimeStamp.
  super_DateTime.m_date = 0x257e44;
  (this->super_initiatorFixture).super_sessionFixture.super_TestCallback.startTimeStamp.
  super_DateTime.m_time = 0x1aa324d61000;
  (this->super_initiatorFixture).super_sessionFixture.super_TestCallback.endTimeStamp.super_DateTime
  .m_date = 0x268636;
  (this->super_initiatorFixture).super_sessionFixture.super_TestCallback.endTimeStamp.super_DateTime
  .m_time = 0x354649ac2000;
  (this->super_initiatorFixture).super_sessionFixture.super_TestCallback.startTime.super_DateTime.
  m_date = 0;
  *(undefined8 *)
   &(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.startTime.super_DateTime.
    field_0xc = *(undefined8 *)
                 &(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.
                  startTimeStamp.super_DateTime.field_0xc;
  *(undefined4 *)
   ((long)&(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.startTime.
           super_DateTime.m_time + 4) =
       *(undefined4 *)
        ((long)&(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.
                startTimeStamp.super_DateTime.m_time + 4);
  (this->super_initiatorFixture).super_sessionFixture.super_TestCallback.endTime.super_DateTime.
  m_date = 0;
  *(undefined8 *)
   &(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.endTime.super_DateTime.
    field_0xc = *(undefined8 *)
                 &(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.
                  endTimeStamp.super_DateTime.field_0xc;
  *(undefined4 *)
   ((long)&(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.endTime.
           super_DateTime.m_time + 4) =
       *(undefined4 *)
        ((long)&(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.endTimeStamp.
                super_DateTime.m_time + 4);
  (*(this->super_initiatorFixture).super_sessionFixture.super_TestCallback.super_Responder.
    _vptr_Responder[8])(this,1,0,0x1f);
  (this->super_initiatorFixture).super_sessionFixture.object[0x248] = (Session)0x0;
  createLogon((Logon *)local_2d0,"TW","ISLD",1);
  FIX::Message::Message(local_178,(Message *)local_2d0);
  FIX::Message::~Message((Message *)local_2d0);
  FIX::Session::send((Message *)(this->super_initiatorFixture).super_sessionFixture.object);
  FIX::Session::next();
  FIX::Session::logon((this->super_initiatorFixture).super_sessionFixture.object);
  createLogon((Logon *)local_428,"ISLD","TW",1);
  FIX::Message::Message((Message *)local_2d0,(Message *)local_428);
  FIX::Message::~Message((Message *)local_428);
  pMVar1 = (Message *)(this->super_initiatorFixture).super_sessionFixture.object;
  FIX::DateTime::nowUtc();
  local_580._8_8_ = local_428._8_8_;
  pcStack_570 = pcStack_418;
  local_580._0_8_ = &PTR__DateTime_00326368;
  FIX::Session::next(pMVar1,local_2d0,SUB81(local_580,0));
  FIX::SessionState::setNextSenderMsgSeqNum
            ((SessionState *)((this->super_initiatorFixture).super_sessionFixture.object + 0x250),5)
  ;
  createResendRequest((ResendRequest *)local_580,"ISLD","TW",2,1,10);
  FIX::Message::Message((Message *)local_428,(Message *)local_580);
  FIX::Message::~Message((Message *)local_580);
  pMVar1 = (Message *)(this->super_initiatorFixture).super_sessionFixture.object;
  FIX::DateTime::nowUtc();
  local_590 = (char *)local_580._8_8_;
  pcStack_588 = pcStack_570;
  local_598 = &PTR__DateTime_00326368;
  FIX::Session::next(pMVar1,(UtcTimeStamp *)local_428,SUB81(&local_598,0));
  ppTVar3 = UnitTest::CurrentTest::Results();
  pTVar2 = *ppTVar3;
  local_598._0_4_ = 5;
  local_59c = FIX::SessionState::getNextSenderMsgSeqNum
                        ((SessionState *)
                         ((this->super_initiatorFixture).super_sessionFixture.object + 0x250));
  ppTVar4 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails((TestDetails *)local_580,*ppTVar4,0x818);
  UnitTest::CheckEqual<int,int>(pTVar2,(int *)&local_598,&local_59c,(TestDetails *)local_580);
  ppTVar3 = UnitTest::CurrentTest::Results();
  pTVar2 = *ppTVar3;
  local_598 = (undefined **)CONCAT44(local_598._4_4_,2);
  local_59c = FIX::SessionState::getNextTargetMsgSeqNum
                        ((SessionState *)
                         ((this->super_initiatorFixture).super_sessionFixture.object + 0x250));
  ppTVar4 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails((TestDetails *)local_580,*ppTVar4,0x819);
  UnitTest::CheckEqual<int,int>(pTVar2,(int *)&local_598,&local_59c,(TestDetails *)local_580);
  FIX::Message::~Message((Message *)local_428);
  FIX::Message::~Message((Message *)local_2d0);
  FIX::Message::~Message(local_178);
  return;
}

Assistant:

TEST_FIXTURE(initiatorFixture, ResendRequest_MessagesNotPersistedAndResendEndGreaterThenSeqNums) {
  startTimeStamp = UtcTimeStamp(8, 8, 8, 13, 5, 2015);
  endTimeStamp = UtcTimeStamp(16, 16, 16, 13, 5, 2200);
  startTime = UtcTimeOnly( startTimeStamp );
  endTime = UtcTimeOnly( endTimeStamp );
  createSession(1, 0, 31);

  object->setPersistMessages(false);

  FIX::Message sentLogon = createLogon( "TW", "ISLD", 1 );
  object->send(sentLogon);
  object->next();
  object->logon();

  FIX::Message receivedLogon = createLogon( "ISLD", "TW", 1 );
  object->next(receivedLogon, UtcTimeStamp());

  object->setNextSenderMsgSeqNum(5);

  FIX::Message resendReq = createResendRequest( "ISLD", "TW", 2, 1, 10);
  object->next(resendReq, UtcTimeStamp());

  CHECK_EQUAL(5, object->getExpectedSenderNum());
  CHECK_EQUAL(2, object->getExpectedTargetNum());

}